

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri.c
# Opt level: O1

_Bool intersect_ray_tri(ray *ray,hit *hit,tri *tri)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  uVar2 = *(undefined8 *)(tri->p0)._;
  uVar3 = *(undefined8 *)(ray->org)._;
  fVar4 = (float)uVar2 - (float)uVar3;
  fVar5 = (float)((ulong)uVar2 >> 0x20) - (float)((ulong)uVar3 >> 0x20);
  uVar2 = *(undefined8 *)(ray->dir)._;
  fVar7 = (tri->p0)._[2] - (ray->org)._[2];
  fVar12 = (ray->dir)._[2];
  fVar10 = (float)uVar2;
  fVar11 = (float)((ulong)uVar2 >> 0x20);
  fVar6 = fVar11 * fVar7 - fVar12 * fVar5;
  fVar13 = fVar12 * fVar4 - fVar7 * fVar10;
  fVar14 = fVar10 * fVar5 - fVar4 * fVar11;
  uVar2 = *(undefined8 *)(tri->n)._;
  fVar1 = (tri->n)._[2];
  fVar8 = (float)uVar2;
  fVar9 = (float)((ulong)uVar2 >> 0x20);
  fVar12 = 1.0 / (fVar10 * fVar8 + fVar11 * fVar9 + fVar12 * fVar1);
  uVar2 = *(undefined8 *)(tri->e2)._;
  fVar10 = ((float)uVar2 * fVar6 + (float)((ulong)uVar2 >> 0x20) * fVar13 + (tri->e2)._[2] * fVar14)
           * fVar12;
  if ((((0.0 <= fVar10) &&
       (uVar2 = *(undefined8 *)(tri->e1)._,
       fVar6 = (fVar6 * (float)uVar2 +
               fVar13 * (float)((ulong)uVar2 >> 0x20) + fVar14 * (tri->e1)._[2]) * fVar12,
       0.0 <= fVar6)) && (fVar10 + fVar6 <= 1.0)) &&
     ((fVar12 = (fVar8 * fVar4 + fVar9 * fVar5 + fVar7 * fVar1) * fVar12, ray->t_min <= fVar12 &&
      (fVar12 <= ray->t_max)))) {
    ray->t_max = fVar12;
    *(ulong *)(hit->uv)._ = CONCAT44(fVar6,fVar10);
    return true;
  }
  return false;
}

Assistant:

bool intersect_ray_tri(struct ray* ray, struct hit* hit, const struct tri* tri) {
    struct vec3 c = sub_vec3(tri->p0, ray->org);
    struct vec3 r = cross_vec3(ray->dir, c);

    real_t inv_det = ((real_t)1) / dot_vec3(tri->n, ray->dir);
    real_t u = dot_vec3(r, tri->e2) * inv_det;
    real_t v = dot_vec3(r, tri->e1) * inv_det;

    // These comparisons are designed to return false
    // when one of t, u, or v is a NaN
    if (u >= 0 && v >= 0 && u + v <= 1) {
        real_t t = dot_vec3(tri->n, c) * inv_det;
        if (t >= ray->t_min && t <= ray->t_max) {
            ray->t_max = t;
            hit->uv = make_vec2(u, v);
            return true;
        }
    }

    return false;
}